

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O2

void __thiscall TApp_BuiltinComplexFail_Test::TestBody(TApp_BuiltinComplexFail_Test *this)

{
  bool bVar1;
  long lVar2;
  allocator local_d1;
  AssertHelper local_d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8 [4];
  string local_a8 [32];
  complex<double> local_88;
  string local_70;
  string local_50;
  string local_30;
  
  local_88._M_value._0_8_ = 0x3ff0000000000000;
  local_88._M_value._8_8_ = 0x4000000000000000;
  std::__cxx11::string::string((string *)&local_30,"-c,--complex",(allocator *)local_c8);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_d0);
  std::__cxx11::string::string((string *)&local_70,"COMPLEX",&local_d1);
  CLI::App::add_complex<std::complex<double>>
            (&(this->super_TApp).app,&local_30,&local_88,&local_50,false,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)local_c8,"-c",(allocator *)&local_d0);
  std::__cxx11::string::string(local_a8,"4",&local_d1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_c8,&local_88);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8[0].ptr_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/NewParseTest.cpp"
             ,0x62,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_c8);
  return;
}

Assistant:

TEST_F(TApp, BuiltinComplexFail) {
    cx comp{1, 2};
    app.add_complex("-c,--complex", comp);

    args = {"-c", "4"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}